

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

bool __thiscall Board::solved(Board *this)

{
  char tile;
  char *__end2;
  char *__begin2;
  Row *__range2;
  Row *row;
  char (*__end1) [3];
  char (*__begin1) [3];
  char (*__range1) [3] [3];
  char cur;
  Board *this_local;
  
  __range1._7_1_ = '0';
  __end1 = (char (*) [3])this;
  do {
    if (__end1 == (char (*) [3])&this->field_0x9) {
      return true;
    }
    for (__end2 = *__end1; (char (*) [3])__end2 != __end1 + 1; __end2 = __end2 + 1) {
      if (*__end2 != __range1._7_1_) {
        return false;
      }
      __range1._7_1_ = __range1._7_1_ + '\x01';
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

bool Board::solved() const {
    char cur = '0';

    for (const Board::Row& row : board) {
        for (char tile : row) {
            if (tile != cur++) {
                return false;
            }
        }
    }

    return true;
}